

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForIndexedDraw
          (DeviceContextGLImpl *this,VALUE_TYPE IndexType,Uint32 FirstIndexLocation,
          GLenum *GLIndexType,size_t *FirstIndexByteOffset)

{
  bool bVar1;
  GLenum GVar2;
  Uint32 UVar3;
  Char *pCVar4;
  unsigned_long uVar5;
  unsigned_long local_80;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  size_t *FirstIndexByteOffset_local;
  GLenum *GLIndexType_local;
  Uint32 FirstIndexLocation_local;
  VALUE_TYPE IndexType_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = FirstIndexByteOffset;
  GVar2 = TypeToGLType(IndexType);
  *GLIndexType = GVar2;
  if (((*GLIndexType != 0x1401) && (*GLIndexType != 0x1403)) && (*GLIndexType != 0x1405)) {
    FormatString<char[23]>((string *)local_48,(char (*) [23])"Unsupported index type");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34c);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer);
  if (bVar1) {
    FormatString<char[42]>
              ((string *)local_78,(char (*) [42])"Index Buffer is not bound to the pipeline");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34d);
    std::__cxx11::string::~string((string *)local_78);
  }
  UVar3 = GetValueSize(IndexType);
  local_80 = (ulong)UVar3 * (ulong)FirstIndexLocation +
             (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_IndexDataStartOffset;
  uVar5 = StaticCast<unsigned_long,unsigned_long>(&local_80);
  *(unsigned_long *)msg.field_2._8_8_ = uVar5;
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForIndexedDraw(VALUE_TYPE IndexType, Uint32 FirstIndexLocation, GLenum& GLIndexType, size_t& FirstIndexByteOffset)
{
    GLIndexType = TypeToGLType(IndexType);
    VERIFY(GLIndexType == GL_UNSIGNED_BYTE || GLIndexType == GL_UNSIGNED_SHORT || GLIndexType == GL_UNSIGNED_INT,
           "Unsupported index type");
    VERIFY(m_pIndexBuffer, "Index Buffer is not bound to the pipeline");
    FirstIndexByteOffset = StaticCast<size_t>(GetValueSize(IndexType) * Uint64{FirstIndexLocation} + m_IndexDataStartOffset);
}